

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# neighbor-graph-flooding.c
# Opt level: O2

void mpr_calculate_neighbor_graph_flooding(nhdp_domain *domain,mpr_flooding_data *data)

{
  _Bool _Var1;
  list_entity *plVar2;
  list_entity *plVar3;
  list_entity *plVar4;
  list_entity *graph;
  
  if ((log_global_mask[LOG_MPR] & 1) != 0) {
    oonf_log(LOG_SEVERITY_DEBUG,LOG_MPR,"src/nhdp/mpr/neighbor-graph-flooding.c",0x115,(void *)0x0,0
             ,"Calculate neighbor graph for flooding MPRs");
  }
  graph = (list_entity *)&data->neigh_graph;
  mpr_init_neighbor_graph((neighbor_graph *)graph,&_api_interface);
  if ((log_global_mask[LOG_MPR] & 1) != 0) {
    oonf_log(LOG_SEVERITY_DEBUG,LOG_MPR,"src/nhdp/mpr/neighbor-graph-flooding.c",0xde,(void *)0x0,0,
             "Calculate N1 (flooding) for interface %s",(data->current_interface->_node).key);
  }
  plVar2 = nhdp_db_get_link_list();
  while( true ) {
    plVar2 = plVar2->next;
    plVar4 = plVar2->prev;
    plVar3 = nhdp_db_get_link_list();
    if (plVar4 == plVar3->prev) break;
    *(undefined1 *)((long)&plVar2[-9].next[2].next + 4) = 0;
    _Var1 = _is_allowed_link_tuple(domain,data->current_interface,(nhdp_link *)&plVar2[-0x1e].prev);
    if (_Var1) {
      mpr_add_n1_node_to_set
                ((avl_tree *)graph,(nhdp_neighbor *)plVar2[-9].next,(nhdp_link *)&plVar2[-0x1e].prev
                 ,0);
    }
  }
  if ((log_global_mask[LOG_MPR] & 1) != 0) {
    oonf_log(LOG_SEVERITY_DEBUG,LOG_MPR,"src/nhdp/mpr/neighbor-graph-flooding.c",0xfc,(void *)0x0,0,
             "Calculate N2 for flooding MPRs");
  }
LAB_0013b5b8:
  graph = (((avl_tree *)&graph->next)->list_head).next;
  if (graph->prev == (data->neigh_graph).set_n1.list_head.prev) {
    return;
  }
  plVar4 = graph[-1].next;
  plVar2 = plVar4 + 0x1b;
  do {
    do {
      plVar2 = plVar2->next;
      if (plVar2->prev == plVar4[0x1b].prev) goto LAB_0013b5b8;
    } while (((nhdp_interface *)plVar2[-7].prev[0x13].prev != data->current_interface) ||
            (0xffff00 < *(uint *)((long)&plVar2[7].next + (long)domain->index * 0xc + 4U)));
    mpr_add_addr_node_to_set(&(data->neigh_graph).set_n2,*(netaddr *)(plVar2 + -8),0);
    plVar4 = graph[-1].next;
  } while( true );
}

Assistant:

void
mpr_calculate_neighbor_graph_flooding(const struct nhdp_domain *domain, struct mpr_flooding_data *data) {
  OONF_DEBUG(LOG_MPR, "Calculate neighbor graph for flooding MPRs");

  mpr_init_neighbor_graph(&data->neigh_graph, &_api_interface);
  _calculate_n1(domain, data);
  _calculate_n2(domain, data);
}